

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

size_t anon_unknown.dwarf_15077d::cmFileCommandCurlDebugCallback
                 (CURL *param_1,curl_infotype type,char *chPtr,size_t size,void *data)

{
  vector<char,std::allocator<char>> *this;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f0;
  const_iterator local_e8;
  int local_dc;
  char local_d8 [4];
  int n;
  char buf [128];
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  const_iterator local_40;
  vector<char,std::allocator<char>> *local_38;
  cmFileCommandVectorOfChar *vec;
  void *data_local;
  size_t size_local;
  char *chPtr_local;
  CURL *pCStack_10;
  curl_infotype type_local;
  CURL *param_0_local;
  
  local_38 = (vector<char,std::allocator<char>> *)data;
  vec = (cmFileCommandVectorOfChar *)data;
  data_local = (void *)size;
  size_local = (size_t)chPtr;
  chPtr_local._4_4_ = type;
  pCStack_10 = param_1;
  if (type < CURLINFO_DATA_IN) {
    local_48._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           ((vector<char,_std::allocator<char>_> *)data);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_40,
               &local_48);
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)data,local_40,(char *)size_local,
               (char *)(size_local + (long)data_local));
  }
  else if ((type - CURLINFO_DATA_IN < 4) &&
          (local_dc = sprintf(local_d8,"[%lu bytes data]\n",size), this = local_38, 0 < local_dc)) {
    local_f0._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           ((vector<char,_std::allocator<char>_> *)local_38);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_e8,
               &local_f0);
    std::vector<char,std::allocator<char>>::insert<char*,void>
              (this,local_e8,local_d8,local_d8 + local_dc);
  }
  return 0;
}

Assistant:

static size_t
  cmFileCommandCurlDebugCallback(CURL *, curl_infotype type, char *chPtr,
                                 size_t size, void *data)
    {
    cmFileCommandVectorOfChar *vec
      = static_cast<cmFileCommandVectorOfChar*>(data);
    switch(type)
      {
      case CURLINFO_TEXT:
      case CURLINFO_HEADER_IN:
      case CURLINFO_HEADER_OUT:
        vec->insert(vec->end(), chPtr, chPtr + size);
        break;
      case CURLINFO_DATA_IN:
      case CURLINFO_DATA_OUT:
      case CURLINFO_SSL_DATA_IN:
      case CURLINFO_SSL_DATA_OUT:
        {
        char buf[128];
        int n = sprintf(buf, "[%" KWIML_INT_PRIu64 " bytes data]\n",
                        static_cast<KWIML_INT_uint64_t>(size));
        if (n > 0)
          {
          vec->insert(vec->end(), buf, buf + n);
          }
        }
        break;
      default:
        break;
      }
    return 0;
    }